

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_feature(lysp_yang_ctx *ctx,lysp_feature **features)

{
  lysp_ext_instance **exts;
  lysp_feature *plVar1;
  LY_ERR LVar2;
  long *plVar3;
  char *pcVar4;
  uint16_t *puVar5;
  ly_ctx *plVar6;
  ly_stmt lVar7;
  long lVar8;
  void *parent;
  Elf64_Ehdr *exts_00;
  char **str_p;
  uint16_t *puVar9;
  bool bVar10;
  undefined4 uStack_70;
  ly_stmt kw;
  char *word;
  size_t word_len;
  lysp_qname **local_58;
  uint16_t *local_50;
  uint16_t *local_48;
  char **local_40;
  char *buf;
  
  plVar1 = *features;
  if (plVar1 == (lysp_feature *)0x0) {
    plVar3 = (long *)malloc(0x48);
    if (plVar3 == (long *)0x0) goto LAB_00175300;
    *plVar3 = 1;
    lVar8 = 1;
  }
  else {
    lVar8 = *(long *)&plVar1[-1].flags + 1;
    *(long *)&plVar1[-1].flags = lVar8;
    plVar3 = (long *)realloc(&plVar1[-1].flags,lVar8 * 0x40 | 8);
    if (plVar3 == (long *)0x0) {
      *(long *)&(*features)[-1].flags = *(long *)&(*features)[-1].flags + -1;
LAB_00175300:
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar6,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_feature");
      return LY_EMEM;
    }
    lVar8 = *plVar3;
  }
  *features = (lysp_feature *)(plVar3 + 1);
  plVar3[lVar8 * 8 + -1] = 0;
  (plVar3 + lVar8 * 8 + -1)[1] = 0;
  plVar3[lVar8 * 8 + -3] = 0;
  (plVar3 + lVar8 * 8 + -3)[1] = 0;
  plVar3[lVar8 * 8 + -5] = 0;
  (plVar3 + lVar8 * 8 + -5)[1] = 0;
  plVar3[lVar8 * 8 + -7] = 0;
  (plVar3 + lVar8 * 8 + -7)[1] = 0;
  exts_00 = (Elf64_Ehdr *)&buf;
  LVar2 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&word,(char **)exts_00,&word_len);
  if (LVar2 == LY_SUCCESS) {
    str_p = (char **)(plVar3 + lVar8 * 8 + -7);
    if (buf == (char *)0x0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar4 = word;
      if (word_len == 0) {
        pcVar4 = "";
      }
      LVar2 = lydict_insert(plVar6,pcVar4,word_len,str_p);
    }
    else {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar2 = lydict_insert_zc(plVar6,word,str_p);
    }
    if ((LVar2 == LY_SUCCESS) && (LVar2 = get_keyword(ctx,&kw,&word,&word_len), LVar2 == LY_SUCCESS)
       ) {
      local_40 = str_p;
      if (kw == LY_STMT_SYNTAX_SEMICOLON) {
        bVar10 = false;
      }
      else {
        if (kw != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar6 = (ly_ctx *)0x0;
          }
          else {
            plVar6 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar4 = lyplg_ext_stmt2str(kw);
          ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar4);
          return LY_EVALID;
        }
        LVar2 = get_keyword(ctx,&kw,&word,&word_len);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        bVar10 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
      }
      local_48 = (uint16_t *)(plVar3 + lVar8 * 8);
      exts = (lysp_ext_instance **)(local_48 + -4);
      local_50 = local_48 + -8;
      local_58 = (lysp_qname **)(local_48 + -0x18);
      puVar9 = local_48 + -0xc;
      lVar7 = kw;
      do {
        if (!bVar10) {
          return LY_SUCCESS;
        }
        if (lVar7 == LY_STMT_STATUS) {
          LVar2 = parse_status(ctx,local_48,exts);
        }
        else if (lVar7 == LY_STMT_EXTENSION_INSTANCE) {
          exts_00 = &Elf64_Ehdr_00100000;
          LVar2 = parse_ext(ctx,word,word_len,local_40,LY_STMT_FEATURE,0,exts);
        }
        else if (lVar7 == LY_STMT_IF_FEATURE) {
          LVar2 = parse_qnames(ctx,LY_STMT_IF_FEATURE,local_58,(yang_arg)exts,
                               (lysp_ext_instance **)exts_00);
        }
        else {
          if (lVar7 == LY_STMT_REFERENCE) {
            parent = *(void **)local_50;
            lVar7 = LY_STMT_REFERENCE;
            puVar5 = local_50;
          }
          else {
            if (lVar7 != LY_STMT_DESCRIPTION) {
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar6 = (ly_ctx *)0x0;
              }
              else {
                plVar6 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar4 = lyplg_ext_stmt2str(lVar7);
              ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,"feature");
              return LY_EVALID;
            }
            parent = *(void **)puVar9;
            lVar7 = LY_STMT_DESCRIPTION;
            puVar5 = puVar9;
          }
          exts_00 = (Elf64_Ehdr *)0x2;
          LVar2 = parse_text_field(ctx,parent,lVar7,(uint32_t)puVar5,(char **)0x2,Y_IDENTIF_ARG,
                                   (uint16_t *)exts,(lysp_ext_instance **)CONCAT44(kw,uStack_70));
        }
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        LVar2 = get_keyword(ctx,&kw,&word,&word_len);
        lVar7 = kw;
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        bVar10 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
      } while (((bVar10) || (*exts == (lysp_ext_instance *)0x0)) ||
              (LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
              LVar2 == LY_SUCCESS));
      return LVar2;
    }
  }
  return LVar2;
}

Assistant:

LY_ERR
parse_feature(struct lysp_yang_ctx *ctx, struct lysp_feature **features)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_feature *feat;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *features, feat, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, feat->name, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, feat->dsc, LY_STMT_DESCRIPTION, 0, &feat->dsc, Y_STR_ARG, NULL, &feat->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &feat->iffeatures, Y_STR_ARG, &feat->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, feat->ref, LY_STMT_REFERENCE, 0, &feat->ref, Y_STR_ARG, NULL, &feat->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &feat->flags, &feat->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, feat, LY_STMT_FEATURE, 0, &feat->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "feature");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, feat->exts, ret, cleanup);
    }

cleanup:
    return ret;
}